

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Request * __thiscall
kj::anon_unknown_36::NetworkHttpClient::request
          (Request *__return_storage_ptr__,NetworkHttpClient *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  HttpClient *pHVar1;
  int __flags;
  char *pcVar2;
  void *__child_stack;
  void *__arg;
  size_t sVar3;
  StringPtr url_00;
  StringPtr value;
  String path;
  HttpHeaders headersCopy;
  Url parsed;
  String local_198;
  char local_178 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_170;
  HttpHeaders local_168;
  Url local_108;
  
  __arg = (void *)0x100;
  url_00.content.size_ = 1;
  url_00.content.ptr = (char *)url.content.size_;
  __flags = 1;
  Url::parse(&local_108,(Url *)url.content.ptr,url_00,0x100,SUB82(headers,0));
  Url::toString(&local_198,&local_108,HTTP_REQUEST);
  HttpHeaders::clone(&local_168,(__fn *)headers,__child_stack,__flags,__arg);
  if (local_108.host.content.size_ == 0) {
    local_108.host.content.ptr = "";
  }
  sVar3 = local_108.host.content.size_ + (local_108.host.content.size_ == 0);
  value.content.size_ = sVar3;
  value.content.ptr = local_108.host.content.ptr;
  requireValidHeaderValue(value);
  local_168.indexedHeaders.ptr[0xb].content.ptr = local_108.host.content.ptr;
  local_168.indexedHeaders.ptr[0xb].content.size_ = sVar3;
  pHVar1 = getClient(this,&local_108);
  pcVar2 = local_198.content.ptr;
  if (local_198.content.size_ == 0) {
    pcVar2 = "";
  }
  local_178[0] = (expectedBodySize->ptr).isSet;
  if ((bool)local_178[0] == true) {
    local_170 = (expectedBodySize->ptr).field_1;
  }
  (**pHVar1->_vptr_HttpClient)
            (__return_storage_ptr__,pHVar1,(ulong)method,pcVar2,
             local_198.content.size_ + (local_198.content.size_ == 0),&local_168,local_178);
  HttpHeaders::~HttpHeaders(&local_168);
  sVar3 = local_198.content.size_;
  pcVar2 = local_198.content.ptr;
  if (local_198.content.ptr != (char *)0x0) {
    local_198.content.ptr = (char *)0x0;
    local_198.content.size_ = 0;
    (**(local_198.content.disposer)->_vptr_ArrayDisposer)
              (local_198.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  Url::~Url(&local_108);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We need to parse the proxy-style URL to convert it to host-style.
    // Use URL parsing options that avoid unnecessary rewrites.
    Url::Options urlOptions;
    urlOptions.allowEmpty = true;
    urlOptions.percentDecode = false;

    auto parsed = Url::parse(url, Url::HTTP_PROXY_REQUEST, urlOptions);
    auto path = parsed.toString(Url::HTTP_REQUEST);
    auto headersCopy = headers.clone();
    headersCopy.set(HttpHeaderId::HOST, parsed.host);
    return getClient(parsed).request(method, path, headersCopy, expectedBodySize);
  }